

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qframe.cpp
# Opt level: O0

void __thiscall QFramePrivate::updateFrameWidth(QFramePrivate *this)

{
  QFramePrivate *in_RDI;
  long in_FS_OFFSET;
  QRect QVar1;
  QFrame *q;
  QRect fr;
  QWidgetPrivate *this_00;
  
  this_00 = *(QWidgetPrivate **)(in_FS_OFFSET + 0x28);
  q_func(in_RDI);
  QVar1 = QFrame::frameRect((QFrame *)&DAT_aaaaaaaaaaaaaaaa);
  updateStyledFrameWidths((QFramePrivate *)fr._8_8_);
  QFrame::setFrameRect((QFrame *)this_00,QVar1._8_8_);
  QWidgetPrivate::setLayoutItemMargins(this_00,QVar1.y2.m_i.m_i,QVar1._0_8_);
  if (*(QWidgetPrivate **)(in_FS_OFFSET + 0x28) == this_00) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFramePrivate::updateFrameWidth()
{
    Q_Q(QFrame);
    QRect fr = q->frameRect();
    updateStyledFrameWidths();
    q->setFrameRect(fr);
    setLayoutItemMargins(QStyle::SE_FrameLayoutItem);
}